

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

GLFWbool refreshVideoModes(_GLFWmonitor *monitor)

{
  GLFWvidmode *__base;
  GLFWbool GVar1;
  int modeCount;
  int local_1c;
  
  GVar1 = 1;
  if (monitor->modes == (GLFWvidmode *)0x0) {
    __base = _glfwPlatformGetVideoModes(monitor,&local_1c);
    if (__base == (GLFWvidmode *)0x0) {
      GVar1 = 0;
    }
    else {
      qsort(__base,(long)local_1c,0x18,compareVideoModes);
      free(monitor->modes);
      monitor->modes = __base;
      monitor->modeCount = local_1c;
    }
  }
  return GVar1;
}

Assistant:

static GLFWbool refreshVideoModes(_GLFWmonitor* monitor)
{
    int modeCount;
    GLFWvidmode* modes;

    if (monitor->modes)
        return GLFW_TRUE;

    modes = _glfwPlatformGetVideoModes(monitor, &modeCount);
    if (!modes)
        return GLFW_FALSE;

    qsort(modes, modeCount, sizeof(GLFWvidmode), compareVideoModes);

    free(monitor->modes);
    monitor->modes = modes;
    monitor->modeCount = modeCount;

    return GLFW_TRUE;
}